

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O1

char * __thiscall
cmCompiledGeneratorExpression::EvaluateWithContext
          (cmCompiledGeneratorExpression *this,cmGeneratorExpressionContext *context,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  pointer ppcVar1;
  pointer ppcVar2;
  string *psVar3;
  long *local_58 [2];
  long local_48 [2];
  cmGeneratorExpressionDAGChecker *local_38;
  
  if (this->NeedsEvaluation == false) {
    psVar3 = &this->Input;
  }
  else {
    psVar3 = &this->Output;
    local_38 = dagChecker;
    std::__cxx11::string::_M_replace
              ((ulong)psVar3,0,(char *)(this->Output)._M_string_length,0x50ea83);
    ppcVar2 = (this->Evaluators).
              super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppcVar1 = (this->Evaluators).
              super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppcVar2 != ppcVar1) {
      do {
        (*(*ppcVar2)->_vptr_cmGeneratorExpressionEvaluator[3])(local_58,*ppcVar2,context,local_38);
        std::__cxx11::string::_M_append((char *)psVar3,(ulong)local_58[0]);
        if (local_58[0] != local_48) {
          operator_delete(local_58[0],local_48[0] + 1);
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&this->SeenTargetProperties,
                   (context->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_left,(_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )&(context->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header);
        if (context->HadError == true) {
          std::__cxx11::string::_M_replace
                    ((ulong)psVar3,0,(char *)(this->Output)._M_string_length,0x50ea83);
          break;
        }
        ppcVar2 = ppcVar2 + 1;
      } while (ppcVar2 != ppcVar1);
    }
    std::
    _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
    ::operator=(&(this->MaxLanguageStandard)._M_t,&(context->MaxLanguageStandard)._M_t);
    if (context->HadError == false) {
      this->HadContextSensitiveCondition = context->HadContextSensitiveCondition;
      this->HadHeadSensitiveCondition = context->HadHeadSensitiveCondition;
      std::
      _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
      ::operator=(&(this->SourceSensitiveTargets)._M_t,&(context->SourceSensitiveTargets)._M_t);
    }
    std::
    _Rb_tree<cmGeneratorTarget_*,_cmGeneratorTarget_*,_std::_Identity<cmGeneratorTarget_*>,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
    ::operator=(&(this->DependTargets)._M_t,&(context->DependTargets)._M_t);
    std::
    _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
    ::operator=(&(this->AllTargetsSeen)._M_t,&(context->AllTargets)._M_t);
  }
  return (psVar3->_M_dataplus)._M_p;
}

Assistant:

const char* cmCompiledGeneratorExpression::EvaluateWithContext(
                            cmGeneratorExpressionContext& context,
                            cmGeneratorExpressionDAGChecker *dagChecker) const
{
  if (!this->NeedsEvaluation)
    {
    return this->Input.c_str();
    }

  this->Output = "";

  std::vector<cmGeneratorExpressionEvaluator*>::const_iterator it
                                                  = this->Evaluators.begin();
  const std::vector<cmGeneratorExpressionEvaluator*>::const_iterator end
                                                  = this->Evaluators.end();

  for ( ; it != end; ++it)
    {
    this->Output += (*it)->Evaluate(&context, dagChecker);

    this->SeenTargetProperties.insert(context.SeenTargetProperties.begin(),
                                      context.SeenTargetProperties.end());
    if (context.HadError)
      {
      this->Output = "";
      break;
      }
    }

  this->MaxLanguageStandard = context.MaxLanguageStandard;

  if (!context.HadError)
    {
    this->HadContextSensitiveCondition = context.HadContextSensitiveCondition;
    this->HadHeadSensitiveCondition = context.HadHeadSensitiveCondition;
    this->SourceSensitiveTargets = context.SourceSensitiveTargets;
    }

  this->DependTargets = context.DependTargets;
  this->AllTargetsSeen = context.AllTargets;
  // TODO: Return a std::string from here instead?
  return this->Output.c_str();
}